

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  Stack<rapidjson::CrtAllocator> *pSVar6;
  SizeType length;
  bool bVar7;
  uint codepoint;
  uint uVar8;
  char *pcVar9;
  Ch c;
  byte *pbVar10;
  StackStream<char> stackStream;
  StackStream<char> local_40;
  
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
  local_40.length_ = 0;
  local_40.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
LAB_0026540d:
  do {
    while( true ) {
      pbVar10 = (byte *)is->current_;
      bVar1 = *pbVar10;
      if (bVar1 == 0x5c) break;
      if (bVar1 == 0x22) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        pSVar6 = local_40.stack_;
        pcVar9 = (local_40.stack_)->stackTop_;
        if ((local_40.stack_)->stackEnd_ == pcVar9 ||
            (long)(local_40.stack_)->stackEnd_ - (long)pcVar9 < 0) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_40.stack_,1);
          pcVar9 = pSVar6->stackTop_;
        }
        length = local_40.length_;
        pSVar6->stackTop_ = pcVar9 + 1;
        *pcVar9 = '\0';
        local_40.length_ = local_40.length_ + 1;
        if (*(int *)(this + 0x30) == 0) {
          pcVar9 = (local_40.stack_)->stackTop_;
          (local_40.stack_)->stackTop_ = pcVar9 + -(ulong)local_40.length_;
          bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::String(handler,pcVar9 + -(ulong)local_40.length_,length,true);
          if (!bVar7) {
            sVar3 = is->count_;
            pCVar4 = is->current_;
            pCVar5 = is->buffer_;
            *(undefined4 *)(this + 0x30) = 0x10;
            *(Ch **)(this + 0x38) = pCVar4 + (sVar3 - (long)pCVar5);
          }
        }
        return;
      }
      if (bVar1 < 0x20) {
        pbVar10 = pbVar10 + (is->count_ - (long)is->buffer_);
        if (bVar1 == 0) {
          *(undefined4 *)(this + 0x30) = 0xb;
        }
        else {
          *(undefined4 *)(this + 0x30) = 0xc;
        }
LAB_00265626:
        *(byte **)(this + 0x38) = pbVar10;
        return;
      }
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      pSVar6 = local_40.stack_;
      pbVar10 = (byte *)(local_40.stack_)->stackTop_;
      if ((byte *)(local_40.stack_)->stackEnd_ == pbVar10 ||
          (long)(local_40.stack_)->stackEnd_ - (long)pbVar10 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_40.stack_,1);
        pbVar10 = (byte *)pSVar6->stackTop_;
      }
      pSVar6->stackTop_ = (char *)(pbVar10 + 1);
      *pbVar10 = bVar1;
      local_40.length_ = local_40.length_ + 1;
    }
    pbVar10 = pbVar10 + (is->count_ - (long)is->buffer_);
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    cVar2 = ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::BasicIStreamWrapper<std::istream>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
            ::escape[(byte)*is->current_];
    if (cVar2 != '\0') {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      pSVar6 = local_40.stack_;
      pcVar9 = (local_40.stack_)->stackTop_;
      if ((local_40.stack_)->stackEnd_ == pcVar9 ||
          (long)(local_40.stack_)->stackEnd_ - (long)pcVar9 < 0) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_40.stack_,1);
        pcVar9 = pSVar6->stackTop_;
      }
      pSVar6->stackTop_ = pcVar9 + 1;
      *pcVar9 = cVar2;
      local_40.length_ = local_40.length_ + 1;
      goto LAB_0026540d;
    }
    if (*is->current_ != 0x75) {
      *(undefined4 *)(this + 0x30) = 10;
      goto LAB_00265626;
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    codepoint = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>(this,is,(size_t)pbVar10);
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if ((codepoint & 0xfffff800) == 0xd800) {
      if (((codepoint < 0xdc00) && (*is->current_ == '\\')) &&
         (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is),
         *is->current_ == 'u')) {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        uVar8 = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>(this,is,(size_t)pbVar10);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if (0xfffffbff < uVar8 - 0xe000) {
          codepoint = codepoint * 0x400 + uVar8 + 0xfca02400;
          goto LAB_002654fd;
        }
      }
      *(undefined4 *)(this + 0x30) = 9;
      goto LAB_00265626;
    }
LAB_002654fd:
    UTF8<char>::
    Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
              (&local_40,codepoint);
  } while( true );
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }